

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O3

void __thiscall Assimp::BVHLoader::ReadMotion(BVHLoader *this,aiScene *param_1)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  pointer pNVar5;
  ulong uVar6;
  pointer pNVar7;
  float fVar8;
  string tokenDuration1;
  string tokenDuration2;
  string tokenFrames;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  float local_1a8 [94];
  
  GetNextToken_abi_cxx11_(&local_1e8,this);
  iVar2 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Expected frame count \"Frames:\", but found \"",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_228);
  }
  fVar8 = GetNextTokenAsFloat(this);
  this->mAnimNumFrames = (uint)(long)fVar8;
  GetNextToken_abi_cxx11_(&local_228,this);
  GetNextToken_abi_cxx11_(&local_208,this);
  iVar2 = std::__cxx11::string::compare((char *)&local_228);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_208);
    if (iVar2 == 0) {
      fVar8 = GetNextTokenAsFloat(this);
      this->mAnimTickDuration = fVar8;
      for (pNVar7 = (this->mNodes).
                    super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar7 != (this->mNodes).
                    super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pNVar7 = pNVar7 + 1) {
        std::vector<float,_std::allocator<float>_>::reserve
                  (&pNVar7->mChannelValues,
                   (ulong)this->mAnimNumFrames *
                   ((long)(pNVar7->mChannels).
                          super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar7->mChannels).
                          super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      uVar3 = this->mAnimNumFrames;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          pNVar5 = (this->mNodes).
                   super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pNVar5 != pNVar7) {
            do {
              if ((pNVar5->mChannels).
                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (pNVar5->mChannels).
                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                uVar6 = 1;
                do {
                  local_1a8[0] = GetNextTokenAsFloat(this);
                  std::vector<float,_std::allocator<float>_>::emplace_back<float>
                            (&pNVar5->mChannelValues,local_1a8);
                  bVar1 = uVar6 < (ulong)((long)(pNVar5->mChannels).
                                                super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pNVar5->mChannels).
                                                super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 2);
                  uVar6 = (ulong)((int)uVar6 + 1);
                } while (bVar1);
                pNVar7 = (this->mNodes).
                         super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              }
              pNVar5 = pNVar5 + 1;
            } while (pNVar5 != pNVar7);
            uVar3 = this->mAnimNumFrames;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Expected frame duration \"Frame Time:\", but found \"",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1c8);
}

Assistant:

void BVHLoader::ReadMotion( aiScene* /*pScene*/)
{
    // Read number of frames
    std::string tokenFrames = GetNextToken();
    if( tokenFrames != "Frames:")
        ThrowException( format() << "Expected frame count \"Frames:\", but found \"" << tokenFrames << "\".");

    float numFramesFloat = GetNextTokenAsFloat();
    mAnimNumFrames = (unsigned int) numFramesFloat;

    // Read frame duration
    std::string tokenDuration1 = GetNextToken();
    std::string tokenDuration2 = GetNextToken();
    if( tokenDuration1 != "Frame" || tokenDuration2 != "Time:")
        ThrowException( format() << "Expected frame duration \"Frame Time:\", but found \"" << tokenDuration1 << " " << tokenDuration2 << "\"." );

    mAnimTickDuration = GetNextTokenAsFloat();

    // resize value vectors for each node
    for( std::vector<Node>::iterator it = mNodes.begin(); it != mNodes.end(); ++it)
        it->mChannelValues.reserve( it->mChannels.size() * mAnimNumFrames);

    // now read all the data and store it in the corresponding node's value vector
    for( unsigned int frame = 0; frame < mAnimNumFrames; ++frame)
    {
        // on each line read the values for all nodes
        for( std::vector<Node>::iterator it = mNodes.begin(); it != mNodes.end(); ++it)
        {
            // get as many values as the node has channels
            for( unsigned int c = 0; c < it->mChannels.size(); ++c)
                it->mChannelValues.push_back( GetNextTokenAsFloat());
        }

        // after one frame worth of values for all nodes there should be a newline, but we better don't rely on it
    }
}